

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jlong Java_fr_limsi_wapiti_WapitiJNI_loadModel(JNIEnv *jenv,jclass jcls,jstring jarg1)

{
  long in_RDX;
  char *e;
  char *e_1;
  mdl_t *result;
  char *arg1;
  jlong jresult;
  char *in_stack_000023c0;
  jstring in_stack_ffffffffffffff98;
  JNIEnv_ *in_stack_ffffffffffffffa0;
  char *local_30;
  mdl_t *local_8;
  
  local_30 = (char *)0x0;
  if ((in_RDX == 0) ||
     (local_30 = JNIEnv_::GetStringUTFChars
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(jboolean *)0x11bee2
                           ), local_30 != (char *)0x0)) {
    local_8 = loadModel(in_stack_000023c0);
    if (local_30 != (char *)0x0) {
      JNIEnv_::ReleaseStringUTFChars((JNIEnv_ *)local_8,in_stack_ffffffffffffff98,(char *)0x11c00c);
    }
  }
  else {
    local_8 = (mdl_t *)0x0;
  }
  return (jlong)local_8;
}

Assistant:

SWIGEXPORT jlong JNICALL Java_fr_limsi_wapiti_WapitiJNI_loadModel(JNIEnv *jenv, jclass jcls, jstring jarg1) {
  jlong jresult = 0 ;
  char *arg1 = (char *) 0 ;
  mdl_t *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  arg1 = 0;
  if (jarg1) {
    arg1 = (char *)jenv->GetStringUTFChars(jarg1, 0);
    if (!arg1) return 0;
  }
  {
    try {
      result = (mdl_t *)loadModel(arg1); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return 0; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return 0; 
      }; 
    }
  }
  *(mdl_t **)&jresult = result; 
  if (arg1) jenv->ReleaseStringUTFChars(jarg1, (const char *)arg1);
  return jresult;
}